

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<double>_>::GetSub
          (TPZMatrix<Fad<double>_> *this,TPZVec<long> *indices,TPZFMatrix<Fad<double>_> *block)

{
  long lVar1;
  long lVar2;
  Fad<double> *this_00;
  long col;
  long row;
  Fad<double> local_50;
  
  lVar1 = indices->fNElements;
  row = 0;
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  for (; row != lVar2; row = row + 1) {
    for (col = 0; lVar1 != col; col = col + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_50,this,indices->fStore[row],indices->fStore[col]);
      this_00 = TPZFMatrix<Fad<double>_>::operator()(block,row,col);
      Fad<double>::operator=(this_00,&local_50);
      Fad<double>::~Fad(&local_50);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}